

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyParser.cpp
# Opt level: O2

bool __thiscall
Assimp::PLY::DOM::ParseHeader
          (DOM *this,IOStreamBuffer<char> *streamBuffer,vector<char,_std::allocator<char>_> *buffer,
          bool isBinary)

{
  bool bVar1;
  Logger *pLVar2;
  Element out;
  
  pLVar2 = DefaultLogger::get();
  Logger::debug(pLVar2,"PLY::DOM::ParseHeader() begin");
  do {
    if ((buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_start ==
        (buffer->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish) {
LAB_0046d74c:
      if (!isBinary) {
        SkipSpacesAndLineEnd(buffer);
      }
      pLVar2 = DefaultLogger::get();
      Logger::debug(pLVar2,"PLY::DOM::ParseHeader() succeeded");
      return true;
    }
    SkipComments(buffer);
    out.alProperties.
    super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    out.alProperties.
    super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    out.alProperties.
    super__Vector_base<Assimp::PLY::Property,_std::allocator<Assimp::PLY::Property>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    out.eSemantic = EEST_INVALID;
    out.szName._M_string_length = 0;
    out.szName.field_2._M_local_buf[0] = '\0';
    out.NumOccur = 0;
    out.szName._M_dataplus._M_p = (pointer)&out.szName.field_2;
    bVar1 = Element::ParseElement(streamBuffer,buffer,&out);
    if (bVar1) {
      std::vector<Assimp::PLY::Element,_std::allocator<Assimp::PLY::Element>_>::push_back
                (&this->alElements,&out);
    }
    else {
      bVar1 = TokenMatch(buffer,"end_header",10);
      if (bVar1) {
        Element::~Element(&out);
        goto LAB_0046d74c;
      }
      IOStreamBuffer<char>::getNextLine(streamBuffer,buffer);
    }
    Element::~Element(&out);
  } while( true );
}

Assistant:

bool PLY::DOM::ParseHeader(IOStreamBuffer<char> &streamBuffer, std::vector<char> &buffer, bool isBinary) {
    ASSIMP_LOG_DEBUG("PLY::DOM::ParseHeader() begin");

  // parse all elements
  while (!buffer.empty())
  {
    // skip all comments
    PLY::DOM::SkipComments(buffer);

    PLY::Element out;
    if (PLY::Element::ParseElement(streamBuffer, buffer, &out))
    {
      // add the element to the list of elements
      alElements.push_back(out);
    }
    else if (TokenMatch(buffer, "end_header", 10))
    {
      // we have reached the end of the header
      break;
    }
    else
    {
      // ignore unknown header elements
      streamBuffer.getNextLine(buffer);
    }
  }

  if (!isBinary) // it would occur an error, if binary data start with values as space or line end.
    SkipSpacesAndLineEnd(buffer);

  ASSIMP_LOG_DEBUG("PLY::DOM::ParseHeader() succeeded");
  return true;
}